

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  BeagleCPUImpl<float,_1,_0> *pBVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pointer pfVar10;
  double *pdVar11;
  float *pfVar12;
  float *pfVar13;
  int pattern;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM4 [64];
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_9d;
  value_type_conflict3 local_9c;
  float *local_98;
  BeagleCPUImpl<float,_1,_0> *local_90;
  float *local_88;
  double local_80;
  double *local_78;
  long local_70;
  long local_68;
  double *local_60;
  float *local_58;
  ulong local_50;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  lVar15 = 0;
  local_98 = preOrderPartial;
  local_90 = this;
  local_88 = postOrderPartial;
  local_80 = edgeLength;
  local_78 = outCrossProducts;
  local_60 = categoryRates;
  local_58 = categoryWeights;
  for (lVar14 = 0; lVar14 < this->kPatternCount; lVar14 = lVar14 + 1) {
    local_9c = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_48,
               (ulong)(uint)(this->kStateCount * this->kStateCount),&local_9c,&local_9d);
    pBVar4 = local_90;
    lVar16 = (long)this->kPartialsPaddedStateCount;
    iVar2 = this->kPatternCount;
    uVar3 = this->kStateCount;
    auVar18 = ZEXT816(0) << 0x40;
    lVar9 = iVar2 * lVar16;
    local_70 = (long)(int)uVar3;
    local_50 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
    uVar5 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3);
    pfVar13 = (float *)((long)local_88 + lVar15 * lVar16);
    pfVar12 = (float *)(lVar15 * lVar16 + (long)local_98);
    for (uVar8 = 0; uVar8 != local_50; uVar8 = uVar8 + 1) {
      auVar20 = ZEXT816(0) << 0x40;
      fVar1 = local_58[uVar8];
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        in_ZMM4 = ZEXT464((uint)pfVar13[uVar6]);
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)pfVar13[uVar6]),
                                  ZEXT416((uint)pfVar12[uVar6]));
      }
      auVar21._0_4_ = (float)((double)(float)local_60[uVar8] * local_80);
      auVar21._4_4_ = (int)((ulong)((double)(float)local_60[uVar8] * local_80) >> 0x20);
      auVar21._8_8_ = 0;
      lVar17 = 0;
      for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * local_98[(uVar8 * (long)iVar2 + lVar14) *
                                                                    lVar16 + uVar6] * pfVar13[uVar7]
                                                  )),auVar21,
                                    ZEXT416(*(uint *)((long)local_48._M_impl.super__Vector_impl_data
                                                            ._M_start + uVar7 * 4 + lVar17)));
          in_ZMM4 = ZEXT1664(auVar19);
          *(int *)((long)local_48._M_impl.super__Vector_impl_data._M_start + uVar7 * 4 + lVar17) =
               auVar19._0_4_;
        }
        lVar17 = lVar17 + local_70 * 4;
      }
      auVar18 = vfmadd231ss_fma(auVar18,auVar20,ZEXT416((uint)fVar1));
      pfVar13 = pfVar13 + lVar9;
      pfVar12 = pfVar12 + lVar9;
    }
    auVar18._0_8_ = local_90->gPatternWeights[lVar14] / (double)auVar18._0_4_;
    auVar18._8_8_ = 0;
    pfVar10 = local_48._M_impl.super__Vector_impl_data._M_start;
    pdVar11 = local_78;
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        auVar19._0_8_ = (double)pfVar10[uVar6];
        auVar19._8_8_ = in_ZMM4._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = pdVar11[uVar6];
        auVar20 = vfmadd213sd_fma(auVar19,auVar18,auVar20);
        pdVar11[uVar6] = auVar20._0_8_;
      }
      pfVar10 = pfVar10 + local_70;
      pdVar11 = pdVar11 + local_70;
    }
    local_68 = lVar15;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
    lVar15 = lVar15 + 4;
    this = pBVar4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}